

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblp.cpp
# Opt level: O0

void * parseArticle(SymbolContext<char> *ctx)

{
  undefined8 this;
  int iVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *contents;
  char *pcVar2;
  char *pcVar3;
  xml_node local_170;
  char_t *local_168;
  const_iterator local_160;
  xpath_node *node;
  const_iterator __end2;
  const_iterator __begin2;
  xpath_node_set *__range2;
  xpath_node_set authors;
  undefined1 local_f0 [8];
  xml_document doc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ret;
  SymbolContext<char> *ctx_local;
  
  iVar1 = Centaurus::SymbolContext<char>::count(ctx);
  if (iVar1 < 1) {
    ctx_local = (SymbolContext<char> *)0x0;
  }
  else {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)operator_new(0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00);
    doc._memory._184_8_ = this_00;
    pugi::xml_document::xml_document((xml_document *)local_f0);
    contents = Centaurus::SymbolContext<char>::start(ctx);
    pcVar2 = Centaurus::SymbolContext<char>::end(ctx);
    pcVar3 = Centaurus::SymbolContext<char>::start(ctx);
    pugi::xml_document::load_buffer
              ((xml_parse_result *)&authors._end,(xml_document *)local_f0,contents,
               (long)pcVar2 - (long)pcVar3,0x74,encoding_auto);
    pugi::xml_node::select_nodes
              ((xpath_node_set *)&__range2,(xml_node *)local_f0,(char_t *)"/article/author/text()",
               (xpath_variable_set *)0x0);
    __begin2 = (const_iterator)&__range2;
    __end2 = pugi::xpath_node_set::begin((xpath_node_set *)__begin2);
    node = pugi::xpath_node_set::end((xpath_node_set *)__begin2);
    for (; this = doc._memory._184_8_, __end2 != node; __end2 = __end2 + 1) {
      local_160 = __end2;
      local_170 = pugi::xpath_node::node(__end2);
      local_168 = pugi::xml_node::value(&local_170);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 (char **)&local_168);
    }
    ctx_local = (SymbolContext<char> *)doc._memory._184_8_;
    pugi::xpath_node_set::~xpath_node_set((xpath_node_set *)&__range2);
    pugi::xml_document::~xml_document((xml_document *)local_f0);
  }
  return ctx_local;
}

Assistant:

void *parseArticle(const SymbolContext<char>& ctx)
{
  if (ctx.count() > 0) {
    auto ret = new std::vector<std::string>;
    pugi::xml_document doc;
    doc.load_buffer(ctx.start(), ctx.end() -  ctx.start());
    pugi::xpath_node_set authors = doc.select_nodes("/article/author/text()");
    for (auto& node : authors) {
      ret->emplace_back(node.node().value());
    }
    return ret;
  } else {
    return nullptr;
  }
}